

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_float_vector
          (exr_context_t ctxt,_internal_exr_seq_scratch *scratch,exr_attr_float_vector_t *attrdata,
          char *aname,char *tname,int32_t attrsz)

{
  exr_context_t in_RCX;
  void *in_RDX;
  _internal_exr_seq_scratch *in_RSI;
  long in_RDI;
  exr_attr_float_vector_t *in_R8;
  uint in_R9D;
  exr_result_t rv;
  int32_t n;
  undefined4 in_stack_ffffffffffffffc0;
  int n_00;
  exr_result_t local_4;
  
  n_00 = 0;
  local_4 = check_bad_attrsz(in_RSI,(int32_t)((ulong)in_RDX >> 0x20),(int32_t)in_RDX,(char *)in_RCX,
                             (char *)in_R8,(int32_t *)((ulong)in_R9D << 0x20));
  exr_attr_float_vector_destroy
            ((exr_context_t)CONCAT44(in_R9D,n_00),
             (exr_attr_float_vector_t *)CONCAT44(local_4,in_stack_ffffffffffffffc0));
  if (((local_4 == 0) && (0 < n_00)) &&
     (local_4 = exr_attr_float_vector_init(in_RCX,in_R8,in_R9D), local_4 == 0)) {
    local_4 = (*in_RSI->sequential_read)(in_RSI,*(void **)((long)in_RDX + 8),(long)(int)in_R9D);
    if (local_4 == 0) {
      priv_to_native32(in_RDX,n_00);
    }
    else {
      exr_attr_float_vector_destroy
                ((exr_context_t)CONCAT44(in_R9D,n_00),
                 (exr_attr_float_vector_t *)CONCAT44(local_4,in_stack_ffffffffffffffc0));
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,10,"Unable to read \'%s\' %s data",in_RCX,in_R8)
      ;
    }
  }
  return local_4;
}

Assistant:

static exr_result_t
extract_attr_float_vector (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_float_vector_t*          attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz)
{
    int32_t      n  = 0;
    exr_result_t rv = check_bad_attrsz (
        scratch, attrsz, (int) sizeof (float), aname, tname, &n);

    /* in case of duplicate attr name in header (mostly fuzz testing) */
    exr_attr_float_vector_destroy (ctxt, attrdata);

    if (rv == EXR_ERR_SUCCESS && n > 0)
    {
        rv = exr_attr_float_vector_init (ctxt, attrdata, n);
        if (rv != EXR_ERR_SUCCESS) return rv;

        rv = scratch->sequential_read (
            scratch, EXR_CONST_CAST (void*, attrdata->arr), (uint64_t) attrsz);
        if (rv != EXR_ERR_SUCCESS)
        {
            exr_attr_float_vector_destroy (ctxt, attrdata);
            return ctxt->print_error (
                ctxt,
                EXR_ERR_READ_IO,
                "Unable to read '%s' %s data",
                aname,
                tname);
        }

        priv_to_native32 (attrdata, n);
    }

    return rv;
}